

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyserexternalvariable.cpp
# Opt level: O0

void __thiscall
AnalyserExternalVariable_dependencyByName_Test::~AnalyserExternalVariable_dependencyByName_Test
          (AnalyserExternalVariable_dependencyByName_Test *this)

{
  AnalyserExternalVariable_dependencyByName_Test *this_local;
  
  ~AnalyserExternalVariable_dependencyByName_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(AnalyserExternalVariable, dependencyByName)
{
    auto parser = libcellml::Parser::create();
    auto model = parser->parseModel(fileContents("generator/hodgkin_huxley_squid_axon_model_1952/model.cellml"));

    EXPECT_EQ(size_t(0), parser->issueCount());

    auto externalVariable = libcellml::AnalyserExternalVariable::create(model->component("membrane")->variable("V"));

    EXPECT_EQ(nullptr, externalVariable->dependency(model, "membrane", "Cm"));

    auto dependency = model->component("membrane")->variable("Cm");

    externalVariable->addDependency(dependency);

    EXPECT_EQ(dependency, externalVariable->dependency(model, "membrane", "Cm"));
    EXPECT_EQ(nullptr, externalVariable->dependency(model, "membrane", "X"));
}